

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.cpp
# Opt level: O0

void __thiscall Material::removeMat4Uniform(Material *this,string *uniformName)

{
  bool bVar1;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
  local_20;
  iterator it;
  string *uniformName_local;
  Material *this_local;
  
  it._M_node = (_Base_ptr)uniformName;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>
  ::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>_>
             ::find(&this->mat4Uniforms,uniformName);
  local_20._M_node = local_28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_glm::tmat4x4<float,_(glm::precision)0>_*>_>_>
       ::end(&this->mat4Uniforms);
  bVar1 = std::operator!=(&local_20,&local_30);
  if (bVar1) {
    std::
    map<std::__cxx11::string,glm::tmat4x4<float,(glm::precision)0>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glm::tmat4x4<float,(glm::precision)0>*>>>
    ::erase_abi_cxx11_((map<std::__cxx11::string,glm::tmat4x4<float,(glm::precision)0>*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,glm::tmat4x4<float,(glm::precision)0>*>>>
                        *)&this->mat4Uniforms,(iterator)local_20._M_node);
  }
  return;
}

Assistant:

void Material::removeMat4Uniform(std::string uniformName)
{
	std::map<std::string, glm::mat4*>::iterator it;
	it = mat4Uniforms.find(uniformName);
	if (it != mat4Uniforms.end())
	{
		mat4Uniforms.erase(it);
	}
}